

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_0::clearColorScreen(Functions *gl,Vec4 *clearColor)

{
  (*gl->clearColor)(clearColor->m_data[0],clearColor->m_data[1],clearColor->m_data[2],
                    clearColor->m_data[3]);
  (*gl->clear)(0x4000);
  return;
}

Assistant:

void clearColorScreen (const glw::Functions& gl, const tcu::Vec4& clearColor)
{
	gl.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
	gl.clear(GL_COLOR_BUFFER_BIT);
}